

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_signer_scriptpubkeyman.cpp
# Opt level: O1

optional<common::PSBTError> __thiscall
wallet::ExternalSignerScriptPubKeyMan::FillPSBT
          (ExternalSignerScriptPubKeyMan *this,PartiallySignedTransaction *psbt,
          PrecomputedTransactionData *txdata,int sighash_type,bool sign,bool bip32derivs,
          int *n_signed,bool finalize)

{
  FormatArg *args;
  long lVar1;
  pointer pPVar2;
  bool bVar3;
  _Optional_payload_base<common::PSBTError> _Var4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  undefined7 in_register_00000081;
  PSBTInput *input;
  pointer input_00;
  long in_FS_OFFSET;
  undefined1 local_d8 [24];
  code *local_c0;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  string strFailReason;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)CONCAT71(in_register_00000081,sign) == 0) {
    _Var4 = (_Optional_payload_base<common::PSBTError>)
            DescriptorScriptPubKeyMan::FillPSBT
                      (&this->super_DescriptorScriptPubKeyMan,psbt,txdata,sighash_type,false,
                       bip32derivs,n_signed,finalize);
    uVar6 = (ulong)_Var4 & 0xffffff0000000000;
    uVar5 = (ulong)_Var4 & 0xffffffff;
    goto LAB_00570028;
  }
  input_00 = (psbt->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
             super__Vector_impl_data._M_start;
  pPVar2 = (psbt->inputs).super__Vector_base<PSBTInput,_std::allocator<PSBTInput>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (input_00 == pPVar2) {
LAB_0056feba:
    uVar5 = 0;
    _Var4._M_payload = (_Storage<common::PSBTError,_true>)0x0;
    _Var4._M_engaged = false;
    _Var4._5_3_ = 0;
  }
  else {
    bVar7 = 1;
    do {
      bVar3 = PSBTInputSigned(input_00);
      bVar7 = bVar7 & bVar3;
      input_00 = input_00 + 1;
    } while (input_00 != pPVar2);
    if (bVar7 != 0) goto LAB_0056feba;
    strFailReason._M_string_length = 0;
    strFailReason.field_2._M_local_buf[0] = '\0';
    strFailReason._M_dataplus._M_p = (pointer)&strFailReason.field_2;
    GetExternalSigner();
    bVar3 = ExternalSigner::SignTransaction((ExternalSigner *)local_d8,psbt,&strFailReason);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_p != &local_68) {
      operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_p != &local_a8) {
      operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
    }
    args = (FormatArg *)(local_d8 + 0x10);
    if ((FormatArg *)local_d8._0_8_ != args) {
      operator_delete((void *)local_d8._0_8_,(ulong)(local_d8._16_8_ + 1));
    }
    if (bVar3) {
      if (finalize) {
        FinalizePSBT(psbt);
      }
      _Var4._M_payload = (_Storage<common::PSBTError,_true>)0x0;
      _Var4._M_engaged = false;
      _Var4._5_3_ = 0;
    }
    else {
      local_d8._8_4_ = 1;
      local_c0 = tinyformat::detail::FormatArg::formatImpl<std::__cxx11::string>;
      local_b8._M_p = (pointer)tinyformat::detail::FormatArg::toIntImpl<std::__cxx11::string>;
      local_d8._0_8_ = args;
      local_d8._16_8_ = &strFailReason;
      tinyformat::detail::formatImpl((ostream *)&std::cerr,"Failed to sign: %s\n",args,1);
      _Var4._M_payload = (_Storage<common::PSBTError,_true>)0x0;
      _Var4._M_engaged = true;
      _Var4._5_3_ = 0;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)strFailReason._M_dataplus._M_p != &strFailReason.field_2) {
      operator_delete(strFailReason._M_dataplus._M_p,
                      CONCAT71(strFailReason.field_2._M_allocated_capacity._1_7_,
                               strFailReason.field_2._M_local_buf[0]) + 1);
    }
    uVar5 = 3;
  }
  uVar6 = 0;
LAB_00570028:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Optional_base<common::PSBTError,_true,_true>)
           (_Optional_base<common::PSBTError,_true,_true>)
           ((ulong)_Var4 & 0xff00000000 | uVar5 | uVar6);
  }
  __stack_chk_fail();
}

Assistant:

std::optional<PSBTError> ExternalSignerScriptPubKeyMan::FillPSBT(PartiallySignedTransaction& psbt, const PrecomputedTransactionData& txdata, int sighash_type, bool sign, bool bip32derivs, int* n_signed, bool finalize) const
{
    if (!sign) {
        return DescriptorScriptPubKeyMan::FillPSBT(psbt, txdata, sighash_type, false, bip32derivs, n_signed, finalize);
    }

    // Already complete if every input is now signed
    bool complete = true;
    for (const auto& input : psbt.inputs) {
        // TODO: for multisig wallets, we should only care if all _our_ inputs are signed
        complete &= PSBTInputSigned(input);
    }
    if (complete) return {};

    std::string strFailReason;
    if(!GetExternalSigner().SignTransaction(psbt, strFailReason)) {
        tfm::format(std::cerr, "Failed to sign: %s\n", strFailReason);
        return PSBTError::EXTERNAL_SIGNER_FAILED;
    }
    if (finalize) FinalizePSBT(psbt); // This won't work in a multisig setup
    return {};
}